

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lights.h
# Opt level: O2

DistantLight *
embree::SceneGraph::DistantLight::lerp
          (DistantLight *__return_storage_ptr__,DistantLight *light0,DistantLight *light1,float f)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  
  fVar18 = 1.0 - f;
  fVar17 = (light1->D).field_0.m128[0];
  fVar1 = (light1->D).field_0.m128[1];
  fVar2 = (light1->D).field_0.m128[2];
  fVar3 = (light1->D).field_0.m128[3];
  fVar4 = (light0->D).field_0.m128[0];
  fVar5 = (light0->D).field_0.m128[1];
  fVar6 = (light0->D).field_0.m128[2];
  fVar7 = (light0->D).field_0.m128[3];
  fVar8 = (light1->L).field_0.m128[0];
  fVar9 = (light1->L).field_0.m128[1];
  fVar10 = (light1->L).field_0.m128[2];
  fVar11 = (light1->L).field_0.m128[3];
  fVar12 = (light0->L).field_0.m128[0];
  fVar13 = (light0->L).field_0.m128[1];
  fVar14 = (light0->L).field_0.m128[2];
  fVar15 = (light0->L).field_0.m128[3];
  fVar16 = f * light1->halfAngle + fVar18 * light0->halfAngle;
  (__return_storage_ptr__->super_Light).type = LIGHT_DISTANT;
  (__return_storage_ptr__->D).field_0.m128[0] = fVar4 * fVar18 + fVar17 * f;
  (__return_storage_ptr__->D).field_0.m128[1] = fVar5 * fVar18 + fVar1 * f;
  (__return_storage_ptr__->D).field_0.m128[2] = fVar6 * fVar18 + fVar2 * f;
  (__return_storage_ptr__->D).field_0.m128[3] = fVar7 * fVar18 + fVar3 * f;
  (__return_storage_ptr__->L).field_0.m128[0] = fVar18 * fVar12 + f * fVar8;
  (__return_storage_ptr__->L).field_0.m128[1] = fVar18 * fVar13 + f * fVar9;
  (__return_storage_ptr__->L).field_0.m128[2] = fVar18 * fVar14 + f * fVar10;
  (__return_storage_ptr__->L).field_0.m128[3] = fVar18 * fVar15 + f * fVar11;
  __return_storage_ptr__->halfAngle = fVar16;
  fVar16 = fVar16 * 0.017453292;
  __return_storage_ptr__->radHalfAngle = fVar16;
  fVar17 = cosf(fVar16);
  __return_storage_ptr__->cosHalfAngle = fVar17;
  return __return_storage_ptr__;
}

Assistant:

static DistantLight lerp(const DistantLight& light0, const DistantLight& light1, const float f)
      {
        return DistantLight(embree::lerp(light0.D,light1.D,f),
                            embree::lerp(light0.L,light1.L,f),
                            embree::lerp(light0.halfAngle,light1.halfAngle,f));
      }